

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_hashtable.cpp
# Opt level: O3

void __thiscall
duckdb::GroupedAggregateHashTable::GroupedAggregateHashTable
          (GroupedAggregateHashTable *this,ClientContext *context_p,Allocator *allocator,
          vector<duckdb::LogicalType,_true> *group_types_p,
          vector<duckdb::LogicalType,_true> *payload_types_p,
          vector<duckdb::AggregateObject,_true> *aggregate_objects_p,idx_t initial_capacity,
          idx_t radix_bits)

{
  shared_ptr<duckdb::TupleDataLayout,_true> *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  element_type *peVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  type allocator_00;
  TupleDataLayout *pTVar3;
  TupleDataLayout *pTVar4;
  const_reference pvVar5;
  type layout;
  undefined1 local_c9;
  TupleDataLayout *local_c8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_c0;
  shared_ptr<duckdb::TupleDataLayout,_true> local_b8;
  RowMatcher *local_a0;
  AggregateHTAppendState *local_98;
  AllocatedData *local_90;
  vector<duckdb::AggregateObject,_std::allocator<duckdb::AggregateObject>_> local_88;
  vector<duckdb::LogicalType,_true> local_68;
  vector<duckdb::LogicalType,_true> local_48;
  
  local_48.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start =
       (payload_types_p->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_48.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (payload_types_p->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_48.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (payload_types_p->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (payload_types_p->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (payload_types_p->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (payload_types_p->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  BaseAggregateHashTable::BaseAggregateHashTable
            (&this->super_BaseAggregateHashTable,context_p,allocator,aggregate_objects_p,&local_48);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_48);
  (this->super_BaseAggregateHashTable)._vptr_BaseAggregateHashTable =
       (_func_int **)&PTR__GroupedAggregateHashTable_02460960;
  this->context = context_p;
  local_a0 = &this->row_matcher;
  (this->row_matcher).match_functions.
  super_vector<duckdb::MatchFunction,_std::allocator<duckdb::MatchFunction>_>.
  super__Vector_base<duckdb::MatchFunction,_std::allocator<duckdb::MatchFunction>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->row_matcher).match_functions.
  super_vector<duckdb::MatchFunction,_std::allocator<duckdb::MatchFunction>_>.
  super__Vector_base<duckdb::MatchFunction,_std::allocator<duckdb::MatchFunction>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->row_matcher).match_functions.
  super_vector<duckdb::MatchFunction,_std::allocator<duckdb::MatchFunction>_>.
  super__Vector_base<duckdb::MatchFunction,_std::allocator<duckdb::MatchFunction>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->radix_bits = radix_bits;
  local_90 = &this->hash_map;
  (this->partitioned_data).
  super_unique_ptr<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::PartitionedTupleData_*,_std::default_delete<duckdb::PartitionedTupleData>_>
  .super__Head_base<0UL,_duckdb::PartitionedTupleData_*,_false>._M_head_impl =
       (PartitionedTupleData *)0x0;
  (this->unpartitioned_data).
  super_unique_ptr<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::PartitionedTupleData_*,_std::default_delete<duckdb::PartitionedTupleData>_>
  .super__Head_base<0UL,_duckdb::PartitionedTupleData_*,_false>._M_head_impl =
       (PartitionedTupleData *)0x0;
  (this->predicates).super_vector<duckdb::ExpressionType,_std::allocator<duckdb::ExpressionType>_>.
  super__Vector_base<duckdb::ExpressionType,_std::allocator<duckdb::ExpressionType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->predicates).super_vector<duckdb::ExpressionType,_std::allocator<duckdb::ExpressionType>_>.
  super__Vector_base<duckdb::ExpressionType,_std::allocator<duckdb::ExpressionType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->predicates).super_vector<duckdb::ExpressionType,_std::allocator<duckdb::ExpressionType>_>.
  super__Vector_base<duckdb::ExpressionType,_std::allocator<duckdb::ExpressionType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->count = 0;
  this->capacity = 0;
  AllocatedData::AllocatedData(local_90);
  this->skip_lookups = false;
  local_c8 = (TupleDataLayout *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<duckdb::ArenaAllocator,std::allocator<duckdb::ArenaAllocator>,duckdb::Allocator&>
            (&local_c0,(ArenaAllocator **)&local_c8,(allocator<duckdb::ArenaAllocator> *)&local_b8,
             allocator);
  (this->aggregate_allocator).internal.
  super___shared_ptr<duckdb::ArenaAllocator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_c8;
  (this->aggregate_allocator).internal.
  super___shared_ptr<duckdb::ArenaAllocator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_c0._M_pi;
  if (local_c0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_c0._M_pi)->_M_use_count = (local_c0._M_pi)->_M_use_count + 1;
      UNLOCK();
      if (local_c0._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_015bd7fa;
    }
    else {
      (local_c0._M_pi)->_M_use_count = (local_c0._M_pi)->_M_use_count + 1;
    }
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c0._M_pi);
  }
LAB_015bd7fa:
  (this->stored_allocators).
  super_vector<duckdb::shared_ptr<duckdb::ArenaAllocator,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ArenaAllocator,_true>_>_>
  .
  super__Vector_base<duckdb::shared_ptr<duckdb::ArenaAllocator,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ArenaAllocator,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->stored_allocators).
  super_vector<duckdb::shared_ptr<duckdb::ArenaAllocator,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ArenaAllocator,_true>_>_>
  .
  super__Vector_base<duckdb::shared_ptr<duckdb::ArenaAllocator,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ArenaAllocator,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->stored_allocators).
  super_vector<duckdb::shared_ptr<duckdb::ArenaAllocator,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ArenaAllocator,_true>_>_>
  .
  super__Vector_base<duckdb::shared_ptr<duckdb::ArenaAllocator,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ArenaAllocator,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  allocator_00 = shared_ptr<duckdb::ArenaAllocator,_true>::operator*(&this->aggregate_allocator);
  local_98 = &this->state;
  AggregateHTAppendState::AggregateHTAppendState(local_98,allocator_00);
  ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
  emplace_back<duckdb::LogicalTypeId_const&>
            ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)group_types_p,
             &LogicalType::HASH);
  local_c8 = (element_type *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<duckdb::TupleDataLayout,std::allocator<duckdb::TupleDataLayout>>
            (&local_c0,&local_c8,(allocator<duckdb::TupleDataLayout> *)&local_c9);
  local_b8.internal.super___shared_ptr<duckdb::TupleDataLayout,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_c8;
  local_b8.internal.super___shared_ptr<duckdb::TupleDataLayout,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = local_c0._M_pi;
  if (local_c0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_c0._M_pi)->_M_use_count = (local_c0._M_pi)->_M_use_count + 1;
      UNLOCK();
      if (local_c0._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_015bd893;
    }
    else {
      (local_c0._M_pi)->_M_use_count = (local_c0._M_pi)->_M_use_count + 1;
    }
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c0._M_pi);
  }
LAB_015bd893:
  pTVar3 = shared_ptr<duckdb::TupleDataLayout,_true>::operator->(&local_b8);
  local_68.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start =
       (group_types_p->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_68.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (group_types_p->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_68.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (group_types_p->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (group_types_p->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (group_types_p->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (group_types_p->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.super__Vector_base<duckdb::AggregateObject,_std::allocator<duckdb::AggregateObject>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (aggregate_objects_p->
       super_vector<duckdb::AggregateObject,_std::allocator<duckdb::AggregateObject>_>).
       super__Vector_base<duckdb::AggregateObject,_std::allocator<duckdb::AggregateObject>_>._M_impl
       .super__Vector_impl_data._M_start;
  local_88.super__Vector_base<duckdb::AggregateObject,_std::allocator<duckdb::AggregateObject>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       (aggregate_objects_p->
       super_vector<duckdb::AggregateObject,_std::allocator<duckdb::AggregateObject>_>).
       super__Vector_base<duckdb::AggregateObject,_std::allocator<duckdb::AggregateObject>_>._M_impl
       .super__Vector_impl_data._M_finish;
  local_88.super__Vector_base<duckdb::AggregateObject,_std::allocator<duckdb::AggregateObject>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (aggregate_objects_p->
       super_vector<duckdb::AggregateObject,_std::allocator<duckdb::AggregateObject>_>).
       super__Vector_base<duckdb::AggregateObject,_std::allocator<duckdb::AggregateObject>_>._M_impl
       .super__Vector_impl_data._M_end_of_storage;
  (aggregate_objects_p->
  super_vector<duckdb::AggregateObject,_std::allocator<duckdb::AggregateObject>_>).
  super__Vector_base<duckdb::AggregateObject,_std::allocator<duckdb::AggregateObject>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (aggregate_objects_p->
  super_vector<duckdb::AggregateObject,_std::allocator<duckdb::AggregateObject>_>).
  super__Vector_base<duckdb::AggregateObject,_std::allocator<duckdb::AggregateObject>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (aggregate_objects_p->
  super_vector<duckdb::AggregateObject,_std::allocator<duckdb::AggregateObject>_>).
  super__Vector_base<duckdb::AggregateObject,_std::allocator<duckdb::AggregateObject>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  TupleDataLayout::Initialize(pTVar3,&local_68,(Aggregates *)&local_88,true,true);
  ::std::vector<duckdb::AggregateObject,_std::allocator<duckdb::AggregateObject>_>::~vector
            (&local_88);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_68);
  _Var2._M_pi = local_b8.internal.
                super___shared_ptr<duckdb::TupleDataLayout,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
  peVar1 = local_b8.internal.super___shared_ptr<duckdb::TupleDataLayout,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  this_00 = &(this->super_BaseAggregateHashTable).layout_ptr;
  local_b8.internal.super___shared_ptr<duckdb::TupleDataLayout,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_b8.internal.super___shared_ptr<duckdb::TupleDataLayout,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_01 = (this->super_BaseAggregateHashTable).layout_ptr.internal.
            super___shared_ptr<duckdb::TupleDataLayout,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
  (this->super_BaseAggregateHashTable).layout_ptr.internal.
  super___shared_ptr<duckdb::TupleDataLayout,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
  (this->super_BaseAggregateHashTable).layout_ptr.internal.
  super___shared_ptr<duckdb::TupleDataLayout,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  pTVar3 = shared_ptr<duckdb::TupleDataLayout,_true>::operator->(this_00);
  pTVar4 = shared_ptr<duckdb::TupleDataLayout,_true>::operator->(this_00);
  pvVar5 = vector<unsigned_long,_true>::operator[]
                     (&pTVar3->offsets,
                      ((long)(pTVar4->types).
                             super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                             .
                             super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(pTVar4->types).
                             super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                             .
                             super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 -
                      1);
  this->hash_offset = *pvVar5;
  InitializePartitionedData(this);
  if (2 < radix_bits) {
    InitializeUnpartitionedData(this);
  }
  Resize(this,initial_capacity);
  pTVar3 = shared_ptr<duckdb::TupleDataLayout,_true>::operator->(this_00);
  local_c8 = (TupleDataLayout *)CONCAT71(local_c8._1_7_,0x28);
  ::std::vector<duckdb::ExpressionType,_std::allocator<duckdb::ExpressionType>_>::resize
            (&(this->predicates).
              super_vector<duckdb::ExpressionType,_std::allocator<duckdb::ExpressionType>_>,
             ((long)(pTVar3->types).
                    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(pTVar3->types).
                    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 - 1,
             (value_type *)&local_c8);
  layout = shared_ptr<duckdb::TupleDataLayout,_true>::operator*(this_00);
  RowMatcher::Initialize(local_a0,true,layout,&this->predicates);
  if (local_b8.internal.super___shared_ptr<duckdb::TupleDataLayout,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b8.internal.
               super___shared_ptr<duckdb::TupleDataLayout,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  return;
}

Assistant:

GroupedAggregateHashTable::GroupedAggregateHashTable(ClientContext &context_p, Allocator &allocator,
                                                     vector<LogicalType> group_types_p,
                                                     vector<LogicalType> payload_types_p,
                                                     vector<AggregateObject> aggregate_objects_p,
                                                     idx_t initial_capacity, idx_t radix_bits)
    : BaseAggregateHashTable(context_p, allocator, aggregate_objects_p, std::move(payload_types_p)), context(context_p),
      radix_bits(radix_bits), count(0), capacity(0), skip_lookups(false),
      aggregate_allocator(make_shared_ptr<ArenaAllocator>(allocator)), state(*aggregate_allocator) {

	// Append hash column to the end and initialise the row layout
	group_types_p.emplace_back(LogicalType::HASH);

	auto layout = make_shared_ptr<TupleDataLayout>();
	layout->Initialize(std::move(group_types_p), std::move(aggregate_objects_p));
	layout_ptr = std::move(layout);

	hash_offset = layout_ptr->GetOffsets()[layout_ptr->ColumnCount() - 1];

	// Partitioned data and pointer table
	InitializePartitionedData();
	if (radix_bits >= UNPARTITIONED_RADIX_BITS_THRESHOLD) {
		InitializeUnpartitionedData();
	}
	Resize(initial_capacity);

	// Predicates
	predicates.resize(layout_ptr->ColumnCount() - 1, ExpressionType::COMPARE_NOT_DISTINCT_FROM);
	row_matcher.Initialize(true, *layout_ptr, predicates);
}